

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void computeYMD(DateTime *p)

{
  int iVar1;
  int iVar2;
  int local_38;
  int local_34;
  int X1;
  int E;
  int D;
  int C;
  int B;
  int A;
  int Z;
  DateTime *p_local;
  
  if (p->validYMD == '\0') {
    if (p->validJD == '\0') {
      p->Y = 2000;
      p->M = 1;
      p->D = 1;
    }
    else {
      iVar2 = (int)((p->iJD + 43200000) / 86400000);
      iVar1 = (int)(((double)iVar2 - 1867216.25) / 36524.25);
      iVar2 = ((iVar2 + iVar1) - iVar1 / 4) + 0x5f5;
      local_38 = (int)(((double)iVar2 - 122.1) / 365.25);
      iVar1 = (local_38 * 0x8ead) / 100;
      local_34 = (int)((double)(iVar2 - iVar1) / 30.6001);
      p->D = (iVar2 - iVar1) - (int)((double)local_34 * 30.6001);
      if (local_34 < 0xe) {
        local_34 = local_34 + -1;
      }
      else {
        local_34 = local_34 + -0xd;
      }
      p->M = local_34;
      if (p->M < 3) {
        local_38 = local_38 + -0x126b;
      }
      else {
        local_38 = local_38 + -0x126c;
      }
      p->Y = local_38;
    }
    p->validYMD = '\x01';
  }
  return;
}

Assistant:

static void computeYMD(DateTime *p){
  int Z, A, B, C, D, E, X1;
  if( p->validYMD ) return;
  if( !p->validJD ){
    p->Y = 2000;
    p->M = 1;
    p->D = 1;
  }else{
    Z = (int)((p->iJD + 43200000)/86400000);
    A = (int)((Z - 1867216.25)/36524.25);
    A = Z + 1 + A - (A/4);
    B = A + 1524;
    C = (int)((B - 122.1)/365.25);
    D = (36525*C)/100;
    E = (int)((B-D)/30.6001);
    X1 = (int)(30.6001*E);
    p->D = B - D - X1;
    p->M = E<14 ? E-1 : E-13;
    p->Y = p->M>2 ? C - 4716 : C - 4715;
  }
  p->validYMD = 1;
}